

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalWatcomWMakeGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalWatcomWMakeGenerator::cmGlobalWatcomWMakeGenerator
          (cmGlobalWatcomWMakeGenerator *this,cmake *cm)

{
  cmGlobalUnixMakefileGenerator3::cmGlobalUnixMakefileGenerator3
            (&this->super_cmGlobalUnixMakefileGenerator3,cm);
  (this->super_cmGlobalUnixMakefileGenerator3).super_cmGlobalGenerator._vptr_cmGlobalGenerator =
       (_func_int **)&PTR__cmGlobalUnixMakefileGenerator3_0066cb98;
  std::__cxx11::string::assign
            ((char *)&(this->super_cmGlobalUnixMakefileGenerator3).super_cmGlobalGenerator.
                      FindMakeProgramFile);
  (this->super_cmGlobalUnixMakefileGenerator3).super_cmGlobalGenerator.ToolSupportsColor = true;
  (this->super_cmGlobalUnixMakefileGenerator3).super_cmGlobalGenerator.NeedSymbolicMark = true;
  std::__cxx11::string::assign
            ((char *)&(this->super_cmGlobalUnixMakefileGenerator3).EmptyRuleHackCommand);
  cmState::SetWatcomWMake(cm->State,true);
  std::__cxx11::string::assign
            ((char *)&(this->super_cmGlobalUnixMakefileGenerator3).IncludeDirective);
  (this->super_cmGlobalUnixMakefileGenerator3).DefineWindowsNULL = true;
  (this->super_cmGlobalUnixMakefileGenerator3).UnixCD = false;
  std::__cxx11::string::assign
            ((char *)&(this->super_cmGlobalUnixMakefileGenerator3).super_cmGlobalGenerator.
                      MakeSilentFlag);
  return;
}

Assistant:

cmGlobalWatcomWMakeGenerator::cmGlobalWatcomWMakeGenerator(cmake* cm)
  : cmGlobalUnixMakefileGenerator3(cm)
{
  this->FindMakeProgramFile = "CMakeFindWMake.cmake";
#ifdef _WIN32
  this->ForceUnixPaths = false;
#endif
  this->ToolSupportsColor = true;
  this->NeedSymbolicMark = true;
  this->EmptyRuleHackCommand = "@cd .";
#ifdef _WIN32
  cm->GetState()->SetWindowsShell(true);
#endif
  cm->GetState()->SetWatcomWMake(true);
  this->IncludeDirective = "!include";
  this->DefineWindowsNULL = true;
  this->UnixCD = false;
  this->MakeSilentFlag = "-h";
}